

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O3

void __thiscall
flatbuffers::go::GoGenerator::GenStruct(GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  FieldDef *field;
  pointer ppFVar1;
  
  if ((struct_def->super_Definition).generated != false) {
    return;
  }
  this->cur_name_space_ = (struct_def->super_Definition).defined_namespace;
  GenComment(&(struct_def->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"");
  if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
    GenNativeStruct(this,struct_def,code_ptr);
  }
  BeginClass(this,struct_def,code_ptr);
  if (struct_def->fixed == false) {
    NewRootTypeFromBuffer(this,struct_def,code_ptr);
  }
  InitializeExisting(this,struct_def,code_ptr);
  GenTableAccessor(this,struct_def,code_ptr);
  for (ppFVar1 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar1 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar1 = ppFVar1 + 1) {
    field = *ppFVar1;
    if (field->deprecated == false) {
      GenStructAccessor(this,struct_def,field,code_ptr);
      GenStructMutator(this,struct_def,field,code_ptr);
      if ((struct_def->fixed == false) && (field->key == true)) {
        GenKeyCompare(this,struct_def,field,code_ptr);
        GenLookupByKey(this,struct_def,field,code_ptr);
      }
    }
  }
  if (struct_def->fixed != false) {
    GenStructBuilder(this,struct_def,code_ptr);
    return;
  }
  GenTableBuilders(this,struct_def,code_ptr);
  return;
}

Assistant:

void GenStruct(const StructDef &struct_def, std::string *code_ptr) {
    if (struct_def.generated) return;

    cur_name_space_ = struct_def.defined_namespace;

    GenComment(struct_def.doc_comment, code_ptr, nullptr);
    if (parser_.opts.generate_object_based_api) {
      GenNativeStruct(struct_def, code_ptr);
    }
    BeginClass(struct_def, code_ptr);
    if (!struct_def.fixed) {
      // Generate a special accessor for the table that has been declared as
      // the root type.
      NewRootTypeFromBuffer(struct_def, code_ptr);
    }
    // Generate the Init method that sets the field in a pre-existing
    // accessor object. This is to allow object reuse.
    InitializeExisting(struct_def, code_ptr);
    // Generate _tab accessor
    GenTableAccessor(struct_def, code_ptr);

    // Generate struct fields accessors
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      GenStructAccessor(struct_def, field, code_ptr);
      GenStructMutator(struct_def, field, code_ptr);
      // TODO(michaeltle): Support querying fixed struct by key. Currently,
      // we only support keyed tables.
      if (!struct_def.fixed && field.key) {
        GenKeyCompare(struct_def, field, code_ptr);
        GenLookupByKey(struct_def, field, code_ptr);
      }
    }

    // Generate builders
    if (struct_def.fixed) {
      // create a struct constructor function
      GenStructBuilder(struct_def, code_ptr);
    } else {
      // Create a set of functions that allow table construction.
      GenTableBuilders(struct_def, code_ptr);
    }
  }